

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void sysbvm_gc_iterateRoots
               (sysbvm_context_t *context,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  sysbvm_chunkedAllocatorChunk_t *psVar1;
  sysbvm_stackFrameRecord_t *stackBottomRecord;
  ulong uVar2;
  sysbvm_chunkedAllocatorChunk_s **ppsVar3;
  long lVar4;
  sysbvm_chunkedAllocatorChunk_t *psVar5;
  sysbvm_chunkedAllocatorChunk_s **ppsVar6;
  ulong uVar7;
  
  lVar4 = 0xb8;
  do {
    (*iterationFunction)
              (userdata,(sysbvm_tuple_t *)((long)&(context->heap).firstMallocObject + lVar4));
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x2290);
  for (psVar1 = (context->heap).gcRootTableAllocator.firstChunk;
      psVar1 != (sysbvm_chunkedAllocatorChunk_t *)0x0; psVar1 = psVar1->next) {
    if (7 < psVar1->size) {
      psVar5 = psVar1 + 1;
      uVar2 = psVar1->size >> 3;
      do {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar5);
        psVar5 = (sysbvm_chunkedAllocatorChunk_t *)&psVar5->next;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  for (psVar1 = (context->heap).picTableAllocator.firstChunk;
      psVar1 != (sysbvm_chunkedAllocatorChunk_t *)0x0; psVar1 = psVar1->next) {
    uVar2 = psVar1->size;
    if (0x67 < uVar2) {
      ppsVar3 = &psVar1[1].executableMapping;
      uVar7 = 0;
      do {
        lVar4 = 4;
        ppsVar6 = ppsVar3;
        do {
          (*iterationFunction)(userdata,(sysbvm_tuple_t *)(ppsVar6 + -2));
          (*iterationFunction)(userdata,(sysbvm_tuple_t *)(ppsVar6 + -1));
          (*iterationFunction)(userdata,(sysbvm_tuple_t *)ppsVar6);
          ppsVar6 = ppsVar6 + 3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = uVar7 + 1;
        ppsVar3 = ppsVar3 + 0xd;
      } while (uVar7 != uVar2 / 0x68);
    }
  }
  stackBottomRecord = sysbvm_stackFrame_getActiveRecord();
  sysbvm_stackFrame_iterateGCRootsInStackWith(stackBottomRecord,userdata,iterationFunction);
  return;
}

Assistant:

SYSBVM_API void sysbvm_gc_iterateRoots(sysbvm_context_t *context, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    // Context roots.
    {
        sysbvm_tuple_t *contextRoots = (sysbvm_tuple_t*)&context->roots;
        size_t contextRootCount = sizeof(context->roots) / sizeof(sysbvm_tuple_t);
        for(size_t i = 0; i < contextRootCount; ++i)
            iterationFunction(userdata, &contextRoots[i]);
    }

    // GC Root table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.gcRootTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t entryCount = iterator.size / sizeof(sysbvm_tuple_t);
            sysbvm_tuple_t *entries = (sysbvm_tuple_t*)iterator.data;
            for(size_t i = 0; i < entryCount; ++i)
                iterationFunction(userdata, entries + i);
        }
    }

    // PIC table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.picTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t picCount = iterator.size / sizeof(sysbvm_pic_t);
            sysbvm_pic_t *pics = (sysbvm_pic_t*)iterator.data;
            for(size_t i = 0; i < picCount; ++i)
            {
                sysbvm_pic_t *pic = pics + i;
                for(size_t j = 0; j < SYSBVM_PIC_ENTRY_COUNT; ++j)
                {
                    sysbvm_picEntry_t *picEntry = pic->entries + j;
                    iterationFunction(userdata, &picEntry->selector);
                    iterationFunction(userdata, &picEntry->type);
                    iterationFunction(userdata, &picEntry->method);
                }
            }
        }
    }

    // Stack roots.
    sysbvm_stackFrame_iterateGCRootsInStackWith(sysbvm_stackFrame_getActiveRecord(), userdata, iterationFunction);
}